

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

void Kit_DsdPrintFromTruth(uint *pTruth,int nVars)

{
  Kit_DsdNtk_t *p;
  Kit_DsdNtk_t *pNtk;
  
  p = Kit_DsdDecomposeInt(pTruth,nVars,8);
  pNtk = Kit_DsdExpand(p);
  Kit_DsdPrint(_stdout,pNtk);
  Kit_DsdVerify(pNtk,pTruth,nVars);
  Kit_DsdNtkFree(pNtk);
  Kit_DsdNtkFree(p);
  return;
}

Assistant:

void Kit_DsdPrintFromTruth( unsigned * pTruth, int nVars )
{
    Kit_DsdNtk_t * pTemp, * pTemp2;
//    pTemp = Kit_DsdDecomposeMux( pTruth, nVars, 5 );
    pTemp = Kit_DsdDecomposeMux( pTruth, nVars, 8 );
//    Kit_DsdPrintExpanded( pTemp );
    pTemp2 = Kit_DsdExpand( pTemp );
    Kit_DsdPrint( stdout, pTemp2 );
    Kit_DsdVerify( pTemp2, pTruth, nVars ); 
    Kit_DsdNtkFree( pTemp2 );
    Kit_DsdNtkFree( pTemp );
}